

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O3

Vec4 __thiscall glcts::SetLumSat(glcts *this,Vec4 *cbase,Vec4 *csat,Vec4 *clum)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  Vec4 VVar10;
  Vec4 local_18;
  
  fVar9 = cbase->m_data[0];
  fVar1 = cbase->m_data[1];
  fVar5 = (float)(~-(uint)(fVar9 <= fVar1) & (uint)fVar1 | -(uint)(fVar9 <= fVar1) & (uint)fVar9);
  fVar2 = cbase->m_data[2];
  uVar3 = -(uint)(fVar5 <= fVar2);
  fVar5 = (float)(~uVar3 & (uint)fVar2 | uVar3 & (uint)fVar5);
  fVar9 = (float)(~-(uint)(fVar1 <= fVar9) & (uint)fVar1 | (uint)fVar9 & -(uint)(fVar1 <= fVar9));
  uVar3 = -(uint)(fVar2 <= fVar9);
  auVar6._0_4_ = (float)(~uVar3 & (uint)fVar2 | uVar3 & (uint)fVar9) - fVar5;
  if (auVar6._0_4_ <= 0.0) {
    local_18.m_data = (float  [4])ZEXT816(0);
  }
  else {
    fVar9 = csat->m_data[0];
    fVar1 = csat->m_data[1];
    fVar2 = csat->m_data[2];
    fVar8 = (float)(~-(uint)(fVar1 <= fVar9) & (uint)fVar1 | -(uint)(fVar1 <= fVar9) & (uint)fVar9);
    uVar3 = -(uint)(fVar2 <= fVar8);
    fVar9 = (float)(~-(uint)(fVar9 <= fVar1) & (uint)fVar1 | (uint)fVar9 & -(uint)(fVar9 <= fVar1));
    uVar4 = -(uint)(fVar9 <= fVar2);
    fVar9 = (float)(~uVar3 & (uint)fVar2 | uVar3 & (uint)fVar8) -
            (float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar9);
    auVar7._0_4_ = fVar9 * (cbase->m_data[0] - fVar5);
    auVar7._4_4_ = fVar9 * (cbase->m_data[1] - fVar5);
    auVar7._8_4_ = fVar9 * (cbase->m_data[2] - fVar5);
    auVar7._12_4_ = fVar9 * (cbase->m_data[3] - fVar5);
    auVar6._4_4_ = auVar6._0_4_;
    auVar6._8_4_ = auVar6._0_4_;
    auVar6._12_4_ = auVar6._0_4_;
    local_18.m_data = (float  [4])divps(auVar7,auVar6);
  }
  VVar10 = SetLum(&local_18,clum);
  return (Vec4)VVar10.m_data;
}

Assistant:

static tcu::Vec4 SetLumSat(const tcu::Vec4& cbase, const tcu::Vec4& csat, const tcu::Vec4& clum)
{
	float	 minbase = MinRGB(cbase);
	float	 sbase   = Saturation(cbase);
	float	 ssat	= Saturation(csat);
	tcu::Vec4 color;
	if (sbase > 0)
	{
		// From the extension spec:
		// Equivalent (modulo rounding errors) to setting the
		// smallest (R,G,B) component to 0, the largest to <ssat>,
		// and interpolating the "middle" component based on its
		// original value relative to the smallest/largest.
		color = (cbase - tcu::Vec4(minbase)) * ssat / sbase;
	}
	else
	{
		color = tcu::Vec4(0.0f);
	}
	return SetLum(color, clum);
}